

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsImageElement.cpp
# Opt level: O3

void __thiscall KDReports::ImageElement::setImage(ImageElement *this,QImage *image)

{
  ImageElementPrivate *pIVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  QSize QVar6;
  Private __tmp;
  QVariant moved;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 uStack_40;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined8 uStack_20;
  
  QVariant::QVariant((QVariant *)&local_58,(QMetaType)0x175f30,image);
  uVar5 = uStack_40;
  uVar4 = local_58._16_8_;
  uVar3 = local_58._8_8_;
  uVar2 = local_58.shared;
  pIVar1 = (this->d)._M_t.
           super___uniq_ptr_impl<KDReports::ImageElementPrivate,_std::default_delete<KDReports::ImageElementPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::ImageElementPrivate_*,_std::default_delete<KDReports::ImageElementPrivate>_>
           .super__Head_base<0UL,_KDReports::ImageElementPrivate_*,_false>._M_head_impl;
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  uStack_40 = 2;
  local_38.shared = (PrivateShared *)*(undefined8 *)&(pIVar1->m_pixmap).d;
  local_38._8_8_ = *(undefined8 *)((long)&(pIVar1->m_pixmap).d + 8);
  local_38._16_8_ = *(undefined8 *)((long)&(pIVar1->m_pixmap).d + 0x10);
  uStack_20 = *(undefined8 *)((long)&(pIVar1->m_pixmap).d + 0x18);
  *(undefined8 *)((long)&(pIVar1->m_pixmap).d + 0x10) = uVar4;
  *(undefined8 *)((long)&(pIVar1->m_pixmap).d + 0x18) = uVar5;
  *(undefined8 *)&(pIVar1->m_pixmap).d = uVar2;
  *(undefined8 *)((long)&(pIVar1->m_pixmap).d + 8) = uVar3;
  QVariant::~QVariant((QVariant *)&local_38);
  QVariant::~QVariant((QVariant *)&local_58);
  QVar6 = (QSize)QImage::size();
  ((this->d)._M_t.
   super___uniq_ptr_impl<KDReports::ImageElementPrivate,_std::default_delete<KDReports::ImageElementPrivate>_>
   ._M_t.
   super__Tuple_impl<0UL,_KDReports::ImageElementPrivate_*,_std::default_delete<KDReports::ImageElementPrivate>_>
   .super__Head_base<0UL,_KDReports::ImageElementPrivate_*,_false>._M_head_impl)->m_pixmapSize =
       QVar6;
  return;
}

Assistant:

void KDReports::ImageElement::setImage(const QImage &image)
{
    d->m_pixmap = QVariant::fromValue(image);
    d->m_pixmapSize = image.size();
}